

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.h
# Opt level: O0

void witness_unlock(witness_tsdn_t *witness_tsdn,witness_t *witness)

{
  witness_list_t *witnesses;
  witness_tsd_t *witness_tsd;
  witness_t *witness_local;
  witness_tsdn_t *witness_tsdn_local;
  
  return;
}

Assistant:

static inline void
witness_unlock(witness_tsdn_t *witness_tsdn, witness_t *witness) {
	witness_tsd_t *witness_tsd;
	witness_list_t *witnesses;

	if (!config_debug) {
		return;
	}

	if (witness_tsdn_null(witness_tsdn)) {
		return;
	}
	witness_tsd = witness_tsdn_tsd(witness_tsdn);
	if (witness->rank == WITNESS_RANK_OMIT) {
		return;
	}

	/*
	 * Check whether owner before removal, rather than relying on
	 * witness_assert_owner() to abort, so that unit tests can test this
	 * function's failure mode without causing undefined behavior.
	 */
	if (witness_owner(witness_tsd, witness)) {
		witnesses = &witness_tsd->witnesses;
		ql_remove(witnesses, witness, link);
	} else {
		witness_assert_owner(witness_tsdn, witness);
	}
}